

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_pixel_ops.cpp
# Opt level: O1

bool dxil_spv::emit_discard_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  ValueKind VVar2;
  Id arg;
  Value *value;
  Constant *this;
  APInt *this_00;
  uint64_t uVar3;
  Operation *this_01;
  Constant *this_02;
  bool bVar4;
  
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  if (value == (Value *)0x0) {
    this_02 = (Constant *)0x0;
  }
  else {
    this = (Constant *)LLVMBC::Internal::resolve_proxy(value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this);
    this_02 = (Constant *)0x0;
    if (VVar2 == ConstantInt) {
      this_02 = this;
    }
  }
  bVar4 = this_02 == (Constant *)0x0;
  if (!bVar4) {
    this_00 = LLVMBC::Constant::getUniqueInteger(this_02);
    uVar3 = LLVMBC::APInt::getZExtValue(this_00);
    if (uVar3 == 0) {
      bVar4 = false;
      bVar1 = false;
      goto LAB_0016a4fa;
    }
  }
  bVar1 = true;
LAB_0016a4fa:
  if (bVar1) {
    this_01 = Converter::Impl::allocate(impl,OpDemoteToHelperInvocation);
    if (bVar4) {
      arg = Converter::Impl::get_id_for_value(impl,value,0);
      Operation::add_id(this_01,arg);
    }
    Converter::Impl::add(impl,this_01,false);
    SPIRVModule::enable_shader_discard(impl->spirv_module,(impl->options).shader_demote);
  }
  return true;
}

Assistant:

bool emit_discard_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto *cond = instruction->getOperand(1);
	bool has_condition = false;
	if (const auto *constant_int = llvm::dyn_cast<llvm::ConstantInt>(cond))
	{
		if (!constant_int->getUniqueInteger().getZExtValue())
			return true;
	}
	else
		has_condition = true;

	Operation *op = impl.allocate(spv::OpDemoteToHelperInvocationEXT);
	if (has_condition)
		op->add_id(impl.get_id_for_value(cond));
	impl.add(op);
	impl.spirv_module.enable_shader_discard(impl.options.shader_demote);
	return true;
}